

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

double zmach(int job)

{
  double dVar1;
  double local_68;
  double value;
  double tiny;
  complex<double> temp3;
  complex<double> temp2;
  complex<double> temp1;
  double s;
  double huge;
  double eps;
  int job_local;
  
  std::complex<double>::complex((complex<double> *)(temp2._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)(temp3._M_value + 8),0.0,0.0);
  std::complex<double>::complex((complex<double> *)&tiny,0.0,0.0);
  huge = 1.0;
  do {
    huge = huge / 2.0;
  } while (1.0 < huge + 1.0);
  local_68 = huge * 2.0;
  temp1._M_value._8_8_ = 0x3ff0000000000000;
  dVar1 = (double)temp1._M_value._8_8_;
  do {
    do {
      temp1._M_value._8_8_ = dVar1;
      dVar1 = (double)temp1._M_value._8_8_ / 16.0;
    } while (dVar1 * 1.0 != 0.0);
  } while (NAN(dVar1 * 1.0));
  dVar1 = sqrt(((double)temp1._M_value._8_8_ / local_68) * 100.0);
  if (((job != 1) && (local_68 = dVar1, job != 2)) && (local_68 = 1.0 / dVar1, job != 3)) {
    local_68 = 0.0;
  }
  return local_68;
}

Assistant:

double zmach ( int job )

//****************************************************************************80
//
//  Purpose:
//
//    ZMACH computes machine parameters for complex <double> arithmetic.
//
//  Discussion:
//
//    Assume the computer has
//
//      B = base of arithmetic;
//      T = number of base B digits;
//      L = smallest possible exponent;
//      U = largest possible exponent;
//
//    then
//
//      EPS = B^(1-T)
//      TINY = 100.0 * B^(-L+T)
//      HUGE = 0.01 * B^(U-T)
//
//    If complex division is done by
//
//      1 / (X+i*Y) = (X-i*Y) / (X^2+Y^2)
//
//    then
//
//      TINY = sqrt ( TINY )
//      HUGE = sqrt ( HUGE )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int JOB:
//    1, EPS is desired;
//    2, TINY is desired;
//    3, HUGE is desired.
//
//    Output, double ZMACH, the requested value.
//
{
  double eps;
  double huge;
  double s;
  complex <double> temp1;
  complex <double> temp2;
  complex <double> temp3;
  double tiny;
  double value;

  eps = 1.0;

  for ( ; ; )
  {
    eps = eps / 2.0;
    s = 1.0 + eps;
    if ( s <= 1.0 )
    {
      break;
    }
  }

  eps = 2.0 * eps;

  s = 1.0;

  for ( ; ; )
  {
    tiny = s;
    s = s / 16.0;

    if ( s * 1.0 == 0.0 )
    {
      break;
    }
  }

  tiny = ( tiny / eps ) * 100.0;
//
//  Had to insert this manually!
//
  tiny = sqrt ( tiny );

  if ( false )
  {
    temp1 = complex <double> ( 1.0,  0.0 );
    temp2 = complex <double> ( tiny, 0.0 );
    temp3 = temp1 / temp2;

    s = real ( temp3 );

    if ( s != 1.0 / tiny )
    {
      tiny = sqrt ( tiny );
    }
  }

  huge = 1.0 / tiny;

  if ( job == 1 )
  {
    value = eps;
  }
  else if ( job == 2 )
  {
    value = tiny;
  }
  else if ( job == 3 )
  {
    value = huge;
  }
  else
  {
    value = 0.0;
  }

  return value;
}